

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O2

int Cec_ManSeqResimulate(Cec_ManSim_t *p,Vec_Ptr_t *vInfo)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  Gia_Man_t *pGVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int i;
  
  iVar6 = p->pAig->nRegs;
  if (vInfo->nSize != (p->pAig->vCis->nSize - iVar6) * p->pPars->nFrames + iVar6) {
    __assert_fail("Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                  ,0x8e,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
  }
  for (i = 0; i < iVar6; i = i + 1) {
    pvVar2 = Vec_PtrEntry(vInfo,i);
    pvVar3 = Vec_PtrEntry(p->vCoSimInfo,(p->pAig->vCos->nSize + i) - p->pAig->nRegs);
    for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
      *(undefined4 *)((long)pvVar3 + lVar5 * 4) = *(undefined4 *)((long)pvVar2 + lVar5 * 4);
    }
    iVar6 = p->pAig->nRegs;
  }
  iVar6 = 0;
  do {
    if (p->pPars->nFrames <= iVar6) {
      if (i == vInfo->nSize) {
        return 0;
      }
      __assert_fail("k == Vec_PtrSize(vInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSeq.c"
                    ,0xa9,"int Cec_ManSeqResimulate(Cec_ManSim_t *, Vec_Ptr_t *)");
    }
    iVar7 = 0;
    while( true ) {
      pGVar4 = p->pAig;
      iVar1 = pGVar4->nRegs;
      if (pGVar4->vCis->nSize - iVar1 <= iVar7) break;
      pvVar2 = Vec_PtrEntry(vInfo,i);
      pvVar3 = Vec_PtrEntry(p->vCiSimInfo,iVar7);
      for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
        *(undefined4 *)((long)pvVar3 + lVar5 * 4) = *(undefined4 *)((long)pvVar2 + lVar5 * 4);
      }
      i = i + 1;
      iVar7 = iVar7 + 1;
    }
    for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCoSimInfo,(iVar7 - iVar1) + pGVar4->vCos->nSize);
      pvVar3 = Vec_PtrEntry(p->vCiSimInfo,(p->pAig->vCis->nSize + iVar7) - p->pAig->nRegs);
      for (lVar5 = 0; lVar5 < p->nWords; lVar5 = lVar5 + 1) {
        *(undefined4 *)((long)pvVar3 + lVar5 * 4) = *(undefined4 *)((long)pvVar2 + lVar5 * 4);
      }
      pGVar4 = p->pAig;
      iVar1 = pGVar4->nRegs;
    }
    iVar7 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
    iVar6 = iVar6 + 1;
  } while (iVar7 == 0);
  return 1;
}

Assistant:

int Cec_ManSeqResimulate( Cec_ManSim_t * p, Vec_Ptr_t * vInfo )
{
    unsigned * pInfo0, * pInfo1;
    int f, i, k, w;
//    assert( Gia_ManRegNum(p->pAig) > 0 );
    assert( Vec_PtrSize(vInfo) == Gia_ManRegNum(p->pAig) + Gia_ManPiNum(p->pAig) * p->pPars->nFrames );
    for ( k = 0; k < Gia_ManRegNum(p->pAig); k++ )
    {
        pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k );
        pInfo1 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + k );
        for ( w = 0; w < p->nWords; w++ )
            pInfo1[w] = pInfo0[w];
    }
    for ( f = 0; f < p->pPars->nFrames; f++ )
    {
        for ( i = 0; i < Gia_ManPiNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, k++ );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        {
            pInfo0 = (unsigned *)Vec_PtrEntry( p->vCoSimInfo, Gia_ManPoNum(p->pAig) + i );
            pInfo1 = (unsigned *)Vec_PtrEntry( p->vCiSimInfo, Gia_ManPiNum(p->pAig) + i );
            for ( w = 0; w < p->nWords; w++ )
                pInfo1[w] = pInfo0[w];
        }
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    assert( k == Vec_PtrSize(vInfo) );
    return 0;
}